

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

bool __thiscall ASigil::HandlePickup(ASigil *this,AInventory *item)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  AInventory *pAVar4;
  int otherPieces;
  AInventory *item_local;
  ASigil *this_local;
  
  bVar1 = DObject::IsKindOf((DObject *)item,RegistrationInfo.MyClass);
  if (bVar1) {
    iVar2 = *(int *)((long)&item[1].super_AActor.Angles.CamRoll.Degrees + 4);
    if (*(int *)&(this->super_AWeapon).field_0x584 < iVar2) {
      item->ItemFlags = item->ItemFlags | 4;
      (this->super_AWeapon).super_AInventory.Icon.texnum = (item->Icon).texnum;
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AWeapon).super_AInventory.Owner);
      if (pAVar3->player != (player_t *)0x0) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AWeapon).super_AInventory.Owner);
        if ((ASigil *)pAVar3->player->ReadyWeapon == this) {
          this->DownPieces = *(int *)&(this->super_AWeapon).field_0x584;
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AWeapon).super_AInventory.Owner);
          pAVar3->player->PendingWeapon = &this->super_AWeapon;
        }
      }
      *(int *)&(this->super_AWeapon).field_0x584 = iVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    bVar1 = TObjPtr<AInventory>::operator!=
                      (&(this->super_AWeapon).super_AInventory.super_AActor.Inventory,
                       (AInventory *)0x0);
    if (bVar1) {
      pAVar4 = TObjPtr<AInventory>::operator->
                         (&(this->super_AWeapon).super_AInventory.super_AActor.Inventory);
      iVar2 = (*(pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                        (pAVar4,item);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ASigil::HandlePickup (AInventory *item)
{
	if (item->IsKindOf (RUNTIME_CLASS(ASigil)))
	{
		int otherPieces = static_cast<ASigil*>(item)->NumPieces;
		if (otherPieces > NumPieces)
		{
			item->ItemFlags |= IF_PICKUPGOOD;
			Icon = item->Icon;
			// If the player is holding the Sigil right now, drop it and bring
			// it back with the new piece(s) in view.
			if (Owner->player != NULL && Owner->player->ReadyWeapon == this)
			{
				DownPieces = NumPieces;
				Owner->player->PendingWeapon = this;
			}
			NumPieces = otherPieces;
		}
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}